

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ScaleWindowsInViewport(ImGuiViewportP *viewport,float scale)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  int local_24;
  int i;
  ImGuiContext *g;
  float scale_local;
  ImGuiViewportP *viewport_local;
  
  pIVar1 = GImGui;
  if (viewport->Window == (ImGuiWindow *)0x0) {
    for (local_24 = 0; local_24 != (pIVar1->Windows).Size; local_24 = local_24 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24);
      if ((*ppIVar2)->Viewport == viewport) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24);
        ScaleWindow(*ppIVar2,scale);
      }
    }
  }
  else {
    ScaleWindow(viewport->Window,scale);
  }
  return;
}

Assistant:

void ImGui::ScaleWindowsInViewport(ImGuiViewportP* viewport, float scale)
{
    ImGuiContext& g = *GImGui;
    if (viewport->Window)
    {
        ScaleWindow(viewport->Window, scale);
    }
    else
    {
        for (int i = 0; i != g.Windows.Size; i++)
            if (g.Windows[i]->Viewport == viewport)
                ScaleWindow(g.Windows[i], scale);
    }
}